

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgm2wav.cpp
# Opt level: O0

void repack_int24le(UINT8 *d,UINT8 *src)

{
  UINT8 *src_local;
  UINT8 *d_local;
  
  return;
}

Assistant:

static inline void repack_int24le(UINT8 *d, const UINT8 *src) {
#ifdef VGM_BIG_ENDIAN
    UINT8 tmp[3];
    memcpy(tmp,src,3);
    d[0] = tmp[2];
    d[1] = tmp[1];
    d[2] = tmp[0];
#endif
}